

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O3

ssize_t __thiscall
nite::UDPSocket::recv(UDPSocket *this,int __fd,void *__buf,size_t __n,int __flags)

{
  ssize_t sVar1;
  undefined4 in_register_00000034;
  
  Packet::reset((Packet *)__buf);
  sVar1 = recv(this,__fd,(void *)((long)__buf + 0x60),__n,__flags);
  std::__cxx11::string::_M_assign((string *)((long)__buf + 0x28));
  *(undefined8 *)((long)__buf + 0x48) = *(undefined8 *)(CONCAT44(in_register_00000034,__fd) + 0x20);
  *(ssize_t *)((long)__buf + 0x58) = sVar1;
  return sVar1;
}

Assistant:

size_t nite::UDPSocket::recv(IP_Port &sender, nite::Packet &buffer){
	buffer.reset();
	size_t s = recv(sender, buffer.data);
	buffer.sender = sender;
	buffer.maxSize = s;
	return s;
}